

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

int __thiscall position::see(position *this,Move *m)

{
  byte bVar1;
  Piece PVar2;
  long lVar3;
  SeePiece *pSVar4;
  pointer pSVar5;
  pointer pSVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  U64 UVar11;
  byte bVar12;
  ulong uVar13;
  Piece PVar14;
  SeePiece *pSVar15;
  uint uVar16;
  uint uVar17;
  Color CVar18;
  ulong uVar19;
  SeePiece SStack_b8;
  pointer piStack_b0;
  Square SStack_a8;
  Square SStack_a4;
  ulong uStack_a0;
  vector<SeePiece,_std::allocator<SeePiece>_> vStack_98;
  vector<SeePiece,_std::allocator<SeePiece>_> vStack_78;
  ulong uStack_58;
  Color CStack_50;
  Color CStack_4c;
  Color CStack_48;
  Square SStack_44;
  SeePiece *pSStack_40;
  SeePiece *pSStack_38;
  
  bVar1 = m->type;
  if (bVar1 == 0xc) {
    return 0;
  }
  if ((bVar1 == 0xb) &&
     (mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [(this->pcs).piece_on._M_elems[m->f]] <=
      mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [(this->pcs).piece_on._M_elems[m->t]])) {
    return mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(this->pcs).piece_on._M_elems[m->t]] -
           mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(this->pcs).piece_on._M_elems[m->f]];
  }
  if ((bVar1 & 0xfc) == 4) {
    bVar12 = 4;
    if ((byte)(bVar1 - 4) < 3) {
      bVar12 = (bVar1 - 4) * -4 + 0x10;
    }
    iVar8 = *(int *)((long)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + (ulong)bVar12) -
            *mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar9 = iVar8 - mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(this->pcs).piece_on._M_elems[m->t]];
    if (iVar9 == 0 ||
        iVar8 < mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[(this->pcs).piece_on._M_elems[m->t]]) {
      return iVar9;
    }
  }
  SStack_a4 = (this->ifo).ks[1];
  SStack_44 = (this->ifo).ks[0];
  SStack_a8 = (Square)m->t;
  bVar1 = m->f;
  uVar19 = (this->pcs).bycolor._M_elems[0];
  uStack_58 = (this->pcs).bycolor._M_elems[1];
  uStack_a0 = uStack_58 | uVar19;
  piStack_b0 = (pointer)(uVar19 ^ (this->ifo).pinned[0]);
  uStack_58 = uStack_58 ^ (this->ifo).pinned[1];
  vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_start = (SeePiece *)0x0;
  vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_finish = (SeePiece *)0x0;
  vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_start = (SeePiece *)0x0;
  vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_finish = (SeePiece *)0x0;
  PVar14 = no_piece;
  do {
    UVar11 = attackers_of(this,&SStack_a8,&uStack_a0);
    uVar19 = UVar11 & uStack_a0;
    if (uVar19 == 0) {
      iVar8 = 3;
    }
    else {
      uStack_a0 = uStack_a0 ^ uVar19;
      SStack_b8.p = pawn;
      CStack_48 = black;
      bVar7 = is_attacked(this,&SStack_44,&SStack_b8.p,&CStack_48,uStack_a0);
      if (bVar7) {
        iVar8 = 1;
      }
      else {
        CStack_4c = black;
        CStack_50 = white;
        bVar7 = is_attacked(this,&SStack_a4,&CStack_4c,&CStack_50,uStack_a0);
        iVar8 = 1;
        if (!bVar7) {
          for (uVar13 = uVar19 & (ulong)piStack_b0; uVar13 != 0; uVar13 = uVar13 & uVar13 - 1) {
            lVar3 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            if ((uint)lVar3 == (uint)bVar1) {
              PVar14 = (this->pcs).piece_on._M_elems[lVar3];
            }
            else {
              SStack_b8.p = (this->pcs).piece_on._M_elems[lVar3];
              SStack_b8.score =
                   (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[SStack_b8.p];
              std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                        (&vStack_98,&SStack_b8);
            }
          }
          for (uVar19 = uVar19 & uStack_58; uVar19 != 0; uVar19 = uVar19 & uVar19 - 1) {
            lVar3 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            if ((uint)lVar3 == (uint)bVar1) {
              PVar14 = (this->pcs).piece_on._M_elems[lVar3];
            }
            else {
              SStack_b8.p = (this->pcs).piece_on._M_elems[lVar3];
              SStack_b8.score =
                   (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[SStack_b8.p];
              std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                        (&vStack_78,&SStack_b8);
            }
          }
          if (((vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start) ||
              (vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start)) || (PVar14 != no_piece)) {
            iVar8 = 0;
          }
        }
      }
    }
    pSVar6 = vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar5 = vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_start;
  } while (iVar8 == 0);
  if (iVar8 != 3) {
    if (vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_start != (SeePiece *)0x0) {
      operator_delete(vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_start != (SeePiece *)0x0) {
      operator_delete(vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  if (vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_start !=
      vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar19 = (long)vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar3 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,
               vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar5,pSVar6);
  }
  pSVar6 = vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar5 = vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_start !=
      vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar19 = (long)vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar3 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,
               vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar5,pSVar6);
  }
  CVar18 = (this->ifo).stm;
  SStack_b8.p = PVar14;
  if (CVar18 == black) {
    SStack_b8.score = 0;
    std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
              (&vStack_78,
               (const_iterator)
               vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,&SStack_b8);
  }
  else {
    SStack_b8.score = 0;
    std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
              (&vStack_98,
               (const_iterator)
               vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,&SStack_b8);
  }
  pSStack_40 = vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start;
  uVar13 = (long)vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  pSStack_38 = vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start;
  uVar19 = (long)vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  piStack_b0 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
  uStack_58 = 8;
  bVar7 = false;
  while (!bVar7) {
    if ((this->pcs).piece_on._M_elems[SStack_a8] == king) {
      uVar10 = 1;
      goto LAB_00121a53;
    }
    CVar18 = CVar18 ^ black;
    bVar7 = true;
  }
  uVar10 = 9;
  if ((uVar13 == 0) || (uVar19 == 0)) goto LAB_00121a53;
  uVar17 = (uint)(CVar18 != white);
  uVar16 = (uint)(CVar18 == white);
  pSVar4 = vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((CVar18 == white) &&
     (pSVar4 = vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start, uVar17 < uVar13)) {
    pSVar15 = vStack_98.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
              super__Vector_impl_data._M_start + uVar17;
LAB_0012192f:
    PVar14 = pSVar15->p;
    iVar8 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[PVar14];
  }
  else {
    PVar14 = no_piece;
    iVar8 = -1;
    if ((CVar18 == black) && (uVar16 < uVar19)) {
      pSVar15 = vStack_78.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start + uVar16;
      goto LAB_0012192f;
    }
  }
  uVar10 = 9;
  if (PVar14 == no_piece) goto LAB_00121a53;
  PVar2 = pSVar4->p;
  if (PVar2 == king ||
      mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [PVar2] < iVar8) {
    if (PVar14 == king) {
      if (CVar18 == black) {
        if (uVar13 <= uVar17) goto LAB_001219c7;
      }
      else if ((CVar18 != white) || (uVar19 <= uVar16)) goto LAB_001219c7;
    }
    else {
LAB_001219c7:
      if (PVar2 == king) {
        if (CVar18 != black) {
          if (CVar18 != white) goto code_r0x00121a37;
          uVar19 = (ulong)uVar17;
          goto joined_r0x001219e3;
        }
        uVar13 = (ulong)uVar16;
      }
      else {
        if (CVar18 == black) {
joined_r0x001219e3:
          if (uVar13 <= uVar19) goto code_r0x00121a37;
          goto LAB_00121a4a;
        }
        if (CVar18 != white) goto code_r0x00121a37;
      }
      if (uVar19 <= uVar13) goto code_r0x00121a37;
    }
LAB_00121a4a:
    uVar10 = 1;
  }
  else {
code_r0x00121a37:
    uVar10 = 0;
  }
LAB_00121a53:
  iVar8 = (*(code *)((long)&DAT_001328d0 + (long)(int)(&DAT_001328d0)[uVar10]))();
  return iVar8;
}

Assistant:

int position::see(const Move& m) const {

	if (m.type == Movetype::ep) return 0;

	else if (m.type == Movetype::capture &&
		(mvals[piece_on(Square(m.f))] <= mvals[piece_on(Square(m.t))])) {
		return (mvals[piece_on(Square(m.t))] - mvals[piece_on(Square(m.f))]);
	}

	else if (m.type == Movetype::capture_promotion_q ||
		m.type == Movetype::capture_promotion_r ||
		m.type == Movetype::capture_promotion_b ||
		m.type == Movetype::capture_promotion_n) {
		int fval = (m.type == Movetype::capture_promotion_q ? mvals[queen] :
			m.type == Movetype::capture_promotion_r ? mvals[rook] :
			m.type == Movetype::capture_promotion_b ? mvals[bishop] :
			mvals[knight]) - mvals[0];
		int tval = mvals[piece_on(Square(m.t))];

		if (fval <= tval) return fval - tval;
	}


	return see_move(m);
}